

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *node)

{
  ImGuiWindow *window_00;
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  ImGuiDockNodeFlags node_flags;
  bool remove;
  bool node_was_active;
  ImGuiWindow *window;
  int window_n;
  ImGuiContext *g;
  ImGuiDockNode *node_local;
  
  pIVar1 = GImGui;
  bVar3 = true;
  if ((node->ParentNode != (ImGuiDockNode *)0x0) &&
     (bVar3 = true, node->ParentNode->ChildNodes[0] != node)) {
    bVar3 = node->ParentNode->ChildNodes[1] == node;
  }
  if (bVar3) {
    if (node->ParentNode != (ImGuiDockNode *)0x0) {
      node->SharedFlags = node->ParentNode->SharedFlags;
    }
    *(ushort *)&node->field_0xbc = *(ushort *)&node->field_0xbc & 0xdfff;
    if (node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
      DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
    }
    if (node->ChildNodes[1] != (ImGuiDockNode *)0x0) {
      DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);
    }
    node->LocalFlagsInWindows = 0;
    window._4_4_ = 0;
    while( true ) {
      if ((node->Windows).Size <= window._4_4_) {
        ImGuiDockNode::UpdateMergedFlags(node);
        if ((((((byte)node->field_0xbe >> 1 & 1) != 0) && ((node->Windows).Size == 1)) &&
            ((node->MergedFlags & 0x40U) != 0)) &&
           (bVar3 = ImGuiDockNode::IsHiddenTabBar(node), !bVar3)) {
          node->field_0xbe = node->field_0xbe & 0xfb | 4;
        }
        node->field_0xbe = node->field_0xbe & 0xfd;
        if (((((byte)node->field_0xbe >> 2 & 1) != 0) && (node->VisibleWindow != (ImGuiWindow *)0x0)
            ) && (((node->VisibleWindow->WindowClass).DockNodeFlagsOverrideSet & 0x2000U) != 0)) {
          node->field_0xbe = node->field_0xbe & 0xfb;
        }
        if ((node->Windows).Size < 2) {
          if (((byte)node->field_0xbe >> 2 & 1) != 0) {
            ImGuiDockNode::SetLocalFlags(node,node->LocalFlags ^ 0x2000);
          }
        }
        else {
          ImGuiDockNode::SetLocalFlags(node,node->LocalFlags & 0xffffdfff);
        }
        node->field_0xbe = node->field_0xbe & 0xfb;
        DockNodeUpdateVisibleFlag(node);
        return;
      }
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&node->Windows,window._4_4_);
      window_00 = *ppIVar2;
      if (window_00->DockNode != node) break;
      bVar4 = node->LastFrameActive + 1 == pIVar1->FrameCount;
      bVar3 = false;
      if (bVar4) {
        bVar3 = window_00->LastFrameActive + 1 < pIVar1->FrameCount;
      }
      bVar5 = false;
      if (((bVar4) &&
          (((*(ushort *)&node->field_0xbc >> 0xe & 1) != 0 ||
           (bVar5 = false, node->WantCloseTabId == window_00->ID)))) &&
         (bVar5 = false, (window_00->HasCloseButton & 1U) != 0)) {
        bVar5 = (window_00->Flags & 0x100000U) == 0;
      }
      if ((bVar3 || bVar5) || ((byte)window_00->field_0x3e1 >> 3 & 1) != 0) {
        window_00->field_0x3e1 = window_00->field_0x3e1 & 0xf7;
        if (((node->Windows).Size == 1) && (bVar3 = ImGuiDockNode::IsCentralNode(node), !bVar3)) {
          DockNodeHideHostWindow(node);
          node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
          DockNodeRemoveWindow(node,window_00,node->ID);
          return;
        }
        DockNodeRemoveWindow(node,window_00,node->ID);
        window._4_4_ = window._4_4_ + -1;
      }
      else {
        node->LocalFlagsInWindows =
             (window_00->WindowClass).DockNodeFlagsOverrideSet | node->LocalFlagsInWindows;
      }
      window._4_4_ = window._4_4_ + 1;
    }
    __assert_fail("window->DockNode == node",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x35d7,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
  }
  __assert_fail("node->ParentNode == __null || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                ,0x35c1,"void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode *)");
}

Assistant:

static void ImGui::DockNodeUpdateFlagsAndCollapse(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->ParentNode == NULL || node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node);

    // Inherit most flags
    if (node->ParentNode)
        node->SharedFlags = node->ParentNode->SharedFlags & ImGuiDockNodeFlags_SharedFlagsInheritMask_;

    // Recurse into children
    // There is the possibility that one of our child becoming empty will delete itself and moving its sibling contents into 'node'.
    // If 'node->ChildNode[0]' delete itself, then 'node->ChildNode[1]->Windows' will be moved into 'node'
    // If 'node->ChildNode[1]' delete itself, then 'node->ChildNode[0]->Windows' will be moved into 'node' and the "remove inactive windows" loop will have run twice on those windows (harmless)
    node->HasCentralNodeChild = false;
    if (node->ChildNodes[0])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[0]);
    if (node->ChildNodes[1])
        DockNodeUpdateFlagsAndCollapse(node->ChildNodes[1]);

    // Remove inactive windows, collapse nodes
    // Merge node flags overrides stored in windows
    node->LocalFlagsInWindows = ImGuiDockNodeFlags_None;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        ImGuiWindow* window = node->Windows[window_n];
        IM_ASSERT(window->DockNode == node);

        bool node_was_active = (node->LastFrameActive + 1 == g.FrameCount);
        bool remove = false;
        remove |= node_was_active && (window->LastFrameActive + 1 < g.FrameCount);
        remove |= node_was_active && (node->WantCloseAll || node->WantCloseTabId == window->ID) && window->HasCloseButton && !(window->Flags & ImGuiWindowFlags_UnsavedDocument);  // Submit all _expected_ closure from last frame
        remove |= (window->DockTabWantClose);
        if (remove)
        {
            window->DockTabWantClose = false;
            if (node->Windows.Size == 1 && !node->IsCentralNode())
            {
                DockNodeHideHostWindow(node);
                node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
                DockNodeRemoveWindow(node, window, node->ID); // Will delete the node so it'll be invalid on return
                return;
            }
            DockNodeRemoveWindow(node, window, node->ID);
            window_n--;
            continue;
        }

        // FIXME-DOCKING: Missing policies for conflict resolution, hence the "Experimental" tag on this.
        //node->LocalFlagsInWindow &= ~window->WindowClass.DockNodeFlagsOverrideClear;
        node->LocalFlagsInWindows |= window->WindowClass.DockNodeFlagsOverrideSet;
    }
    node->UpdateMergedFlags();

    // Auto-hide tab bar option
    ImGuiDockNodeFlags node_flags = node->MergedFlags;
    if (node->WantHiddenTabBarUpdate && node->Windows.Size == 1 && (node_flags & ImGuiDockNodeFlags_AutoHideTabBar) && !node->IsHiddenTabBar())
        node->WantHiddenTabBarToggle = true;
    node->WantHiddenTabBarUpdate = false;

    // Cancel toggling if we know our tab bar is enforced to be hidden at all times
    if (node->WantHiddenTabBarToggle && node->VisibleWindow && (node->VisibleWindow->WindowClass.DockNodeFlagsOverrideSet & ImGuiDockNodeFlags_HiddenTabBar))
        node->WantHiddenTabBarToggle = false;

    // Apply toggles at a single point of the frame (here!)
    if (node->Windows.Size > 1)
        node->SetLocalFlags(node->LocalFlags & ~ImGuiDockNodeFlags_HiddenTabBar);
    else if (node->WantHiddenTabBarToggle)
        node->SetLocalFlags(node->LocalFlags ^ ImGuiDockNodeFlags_HiddenTabBar);
    node->WantHiddenTabBarToggle = false;

    DockNodeUpdateVisibleFlag(node);
}